

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O0

shared_ptr<duckdb::ParquetFileMetadataCache,_true>
duckdb::LoadMetadata
          (ClientContext *context,Allocator *allocator,CachingFileHandle *file_handle,
          shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *encryption_config,
          EncryptionUtil *encryption_util,optional_idx footer_size)

{
  bool bVar1;
  ThriftFileTransport *this;
  undefined8 uVar2;
  unsigned_long a;
  idx_t in;
  InvalidInputException *this_00;
  pointer pFVar3;
  pointer pTVar4;
  ParquetEncryptionConfig *this_01;
  size_t in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<duckdb::ParquetFileMetadataCache,_true> sVar5;
  unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
  geo_metadata;
  templated_unique_single_t crypto_metadata;
  templated_unique_single_t metadata;
  uint32_t read_footer_len;
  data_ptr_t data_ptr;
  optional_ptr<duckdb::ReadHead,_true> read_head;
  idx_t metadata_pos_1;
  idx_t total_footer_len;
  ClientContext *in_stack_00000220;
  FileMetaData *in_stack_00000228;
  uint footer_len_1;
  idx_t metadata_pos;
  uint32_t footer_len;
  ResizeableBuffer buf;
  idx_t prefetch_size;
  bool footer_encrypted;
  idx_t file_size;
  ThriftFileTransport *transport;
  unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
  file_proto;
  time_t current_time;
  ThriftFileTransport *in_stack_fffffffffffffc88;
  pointer in_stack_fffffffffffffc90;
  idx_t in_stack_fffffffffffffc98;
  ThriftFileTransport *in_stack_fffffffffffffca0;
  Allocator *in_stack_fffffffffffffca8;
  ResizeableBuffer *in_stack_fffffffffffffcb0;
  type in_stack_fffffffffffffcb8;
  long *in_stack_fffffffffffffcc0;
  CachingFileHandle *in_stack_fffffffffffffcc8;
  allocator *paVar6;
  optional_idx *in_stack_fffffffffffffcd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  ReadHead *in_stack_fffffffffffffcf8;
  optional_ptr<duckdb::ReadHead,_true> in_stack_fffffffffffffd00;
  CachingFileHandle *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  TProtocol *in_stack_fffffffffffffda8;
  TBase *in_stack_fffffffffffffdb0;
  allocator local_231;
  string local_230 [54];
  undefined1 local_1fa;
  allocator local_1f9;
  string local_1f8 [16];
  bool *in_stack_fffffffffffffe18;
  uint32_t *in_stack_fffffffffffffe20;
  shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *in_stack_fffffffffffffe28;
  idx_t in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  data_ptr_t in_stack_fffffffffffffe40;
  uint local_1b4;
  allocator local_161;
  string local_160 [36];
  uint local_13c;
  idx_t local_138;
  string local_130 [36];
  uint local_10c;
  int local_108;
  unsigned_long local_d8;
  byte local_ca;
  undefined1 local_c9;
  allocator local_a1;
  string local_a0 [32];
  idx_t local_80;
  ThriftFileTransport *local_58;
  undefined8 local_48;
  time_t local_40;
  optional_idx local_10 [2];
  
  local_48 = std::chrono::_V2::system_clock::now();
  local_40 = std::chrono::_V2::system_clock::to_time_t((time_point *)in_stack_fffffffffffffcb0);
  CreateThriftFileProtocol
            (in_stack_fffffffffffffcc8,SUB81((ulong)in_stack_fffffffffffffcc0 >> 0x38,0));
  unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
  ::operator->((unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
                *)in_stack_fffffffffffffc90);
  duckdb_apache::thrift::protocol::TProtocol::getTransport((TProtocol *)in_stack_fffffffffffffc88);
  this = (ThriftFileTransport *)
         std::
         __shared_ptr_access<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator*((__shared_ptr_access<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_fffffffffffffc90);
  std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)0x69ee73);
  local_58 = this;
  local_80 = ThriftFileTransport::GetSize(this);
  if (local_80 < 0xc) {
    local_c9 = 1;
    uVar2 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"File \'%s\' too small to be a Parquet file",&local_a1);
    duckdb::CachingFileHandle::GetPath_abi_cxx11_();
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              ((InvalidInputException *)in_stack_fffffffffffffd00.ptr,
               (string *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    local_c9 = 0;
    __cxa_throw(uVar2,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException
               );
  }
  bVar1 = optional_idx::IsValid(local_10);
  if (bVar1) {
    in = optional_idx::GetIndex(in_stack_fffffffffffffcd0);
    local_13c = UnsafeNumericCast<unsigned_int,unsigned_long,void>(in);
    if ((local_13c == 0) || (local_80 < local_13c + 0xc)) {
      uVar2 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_160,"Invalid footer length provided for file \'%s\'",&local_161);
      duckdb::CachingFileHandle::GetPath_abi_cxx11_();
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                ((InvalidInputException *)in_stack_fffffffffffffd00.ptr,
                 (string *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
      __cxa_throw(uVar2,&InvalidInputException::typeinfo,
                  InvalidInputException::~InvalidInputException);
    }
    ThriftFileTransport::SetLocation(local_58,local_80 - (local_13c + 8));
    ThriftFileTransport::Prefetch
              (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
               (uint64_t)in_stack_fffffffffffffc90);
    in_stack_fffffffffffffd00 = ThriftFileTransport::GetReadHead(in_stack_fffffffffffffc88,0x69f4b3)
    ;
    in_stack_fffffffffffffcf8 =
         optional_ptr<duckdb::ReadHead,_true>::operator->
                   ((optional_ptr<duckdb::ReadHead,_true> *)in_stack_fffffffffffffc90);
    in_stack_fffffffffffffcf0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (in_stack_fffffffffffffcf8->buffer_ptr + local_13c);
    duckdb::CachingFileHandle::GetPath_abi_cxx11_();
    ParseParquetFooter(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30
                       ,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                       in_stack_fffffffffffffe18);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
    if (local_1b4 != local_13c) {
      local_1fa = 1;
      this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1f8,
                 "Parquet footer length stored in file is not equal to footer length provided",
                 &local_1f9);
      duckdb::InvalidInputException::InvalidInputException(this_00,local_1f8);
      local_1fa = 0;
      __cxa_throw(this_00,&InvalidInputException::typeinfo,
                  InvalidInputException::~InvalidInputException);
    }
  }
  else {
    local_d8 = 8;
    bVar1 = ShouldAndCanPrefetch
                      ((ClientContext *)
                       CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                       in_stack_fffffffffffffd98);
    if (bVar1) {
      in_RCX = 0x20c49ba5e353f7cf;
      local_d8 = ClampValue<unsigned_long>
                           ((unsigned_long)in_stack_fffffffffffffc90,
                            (unsigned_long)in_stack_fffffffffffffc88,0x69f080);
      a = duckdb::NextPowerOfTwo(local_d8);
      local_d8 = MinValue<unsigned_long>(a,local_80);
    }
    ResizeableBuffer::ResizeableBuffer((ResizeableBuffer *)in_stack_fffffffffffffc90);
    ResizeableBuffer::resize
              (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
               (uint64_t)in_stack_fffffffffffffca0);
    ByteBuffer::zero((ByteBuffer *)0x69f118);
    ThriftFileTransport::Prefetch
              (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
               (uint64_t)in_stack_fffffffffffffc90);
    ThriftFileTransport::SetLocation(local_58,local_80 - 8);
    ThriftFileTransport::read(local_58,local_108,(void *)0x8,in_RCX);
    duckdb::CachingFileHandle::GetPath_abi_cxx11_();
    ParseParquetFooter(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30
                       ,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                       in_stack_fffffffffffffe18);
    std::__cxx11::string::~string(local_130);
    local_138 = local_80 - (local_10c + 8);
    ThriftFileTransport::SetLocation(local_58,local_138);
    if (local_d8 - 8 < (ulong)local_10c) {
      ThriftFileTransport::Prefetch
                (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                 (uint64_t)in_stack_fffffffffffffc90);
    }
    ResizeableBuffer::~ResizeableBuffer((ResizeableBuffer *)0x69f292);
  }
  make_uniq<duckdb_parquet::FileMetaData>();
  if ((local_ca & 1) == 0) {
    in_stack_fffffffffffffc90 =
         unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
         ::operator->((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
                       *)in_stack_fffffffffffffc90);
    pTVar4 = std::
             unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
             ::get((unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
                    *)in_stack_fffffffffffffc90);
    (**(code **)(*(long *)in_stack_fffffffffffffc90 + 0x10))(in_stack_fffffffffffffc90,pTVar4);
  }
  else {
    make_uniq<duckdb_parquet::FileCryptoMetaData>();
    pFVar3 = unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
             ::operator->((unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
                           *)in_stack_fffffffffffffc90);
    pTVar4 = std::
             unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
             ::get((unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
                    *)in_stack_fffffffffffffc90);
    (**(code **)(*(long *)pFVar3 + 0x10))(pFVar3,pTVar4);
    pFVar3 = unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
             ::operator->((unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
                           *)in_stack_fffffffffffffc90);
    if (((byte)(pFVar3->encryption_algorithm).__isset >> 1 & 1) != 0) {
      uVar2 = __cxa_allocate_exception(0x10);
      paVar6 = &local_231;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_230,
                 "File \'%s\' is encrypted with AES_GCM_CTR_V1, but only AES_GCM_V1 is supported",
                 paVar6);
      duckdb::CachingFileHandle::GetPath_abi_cxx11_();
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                ((InvalidInputException *)in_stack_fffffffffffffd00.ptr,
                 (string *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
      __cxa_throw(uVar2,&InvalidInputException::typeinfo,
                  InvalidInputException::~InvalidInputException);
    }
    in_stack_fffffffffffffcb8 =
         unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
         ::operator*((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
                      *)in_stack_fffffffffffffc90);
    unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
    ::operator*((unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
                 *)in_stack_fffffffffffffc90);
    this_01 = shared_ptr<const_duckdb::ParquetEncryptionConfig,_true>::operator->
                        ((shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *)
                         in_stack_fffffffffffffc90);
    ParquetEncryptionConfig::GetFooterKey_abi_cxx11_(this_01);
    ParquetCrypto::Read(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                        (string *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                        (EncryptionUtil *)in_stack_fffffffffffffd98);
    unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
    ::~unique_ptr((unique_ptr<duckdb_parquet::FileCryptoMetaData,_std::default_delete<duckdb_parquet::FileCryptoMetaData>,_true>
                   *)0x69f8da);
  }
  unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
  ::operator*((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
               *)in_stack_fffffffffffffc90);
  GeoParquetFileMetadata::TryRead(in_stack_00000228,in_stack_00000220);
  make_shared_ptr<duckdb::ParquetFileMetadataCache,duckdb::unique_ptr<duckdb_parquet::FileMetaData,std::default_delete<duckdb_parquet::FileMetaData>,true>,long&,duckdb::unique_ptr<duckdb::GeoParquetFileMetadata,std::default_delete<duckdb::GeoParquetFileMetadata>,true>>
            ((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
              *)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
             (unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
              *)in_stack_fffffffffffffcb8);
  unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
  ::~unique_ptr((unique_ptr<duckdb::GeoParquetFileMetadata,_std::default_delete<duckdb::GeoParquetFileMetadata>,_true>
                 *)0x69f986);
  unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
  ::~unique_ptr((unique_ptr<duckdb_parquet::FileMetaData,_std::default_delete<duckdb_parquet::FileMetaData>,_true>
                 *)0x69f993);
  unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
  ::~unique_ptr((unique_ptr<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>,_true>
                 *)0x69f9a0);
  sVar5.internal.super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar5.internal.super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (shared_ptr<duckdb::ParquetFileMetadataCache,_true>)
         sVar5.internal.
         super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static shared_ptr<ParquetFileMetadataCache>
LoadMetadata(ClientContext &context, Allocator &allocator, CachingFileHandle &file_handle,
             const shared_ptr<const ParquetEncryptionConfig> &encryption_config, const EncryptionUtil &encryption_util,
             optional_idx footer_size) {
	auto current_time = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());

	auto file_proto = CreateThriftFileProtocol(file_handle, false);
	auto &transport = reinterpret_cast<ThriftFileTransport &>(*file_proto->getTransport());
	auto file_size = transport.GetSize();
	if (file_size < 12) {
		throw InvalidInputException("File '%s' too small to be a Parquet file", file_handle.GetPath());
	}

	bool footer_encrypted;
	// footer size is not provided - read it from the back
	if (!footer_size.IsValid()) {
		// We have to do two reads here:
		// 1. The 8 bytes from the back to check if it's a Parquet file and the footer size
		// 2. The footer (after getting the size)
		// For local reads this doesn't matter much, but for remote reads this means two round trips,
		// which is especially bad for small Parquet files where the read cost is mostly round trips.
		// So, we prefetch more, to hopefully save a round trip.
		static constexpr idx_t ESTIMATED_FOOTER_RATIO = 1000; // Estimate 1/1000th of the file to be footer
		static constexpr idx_t MIN_PREFETCH_SIZE = 16384;     // Prefetch at least this many bytes
		static constexpr idx_t MAX_PREFETCH_SIZE = 262144;    // Prefetch at most this many bytes
		idx_t prefetch_size = 8;
		if (ShouldAndCanPrefetch(context, file_handle)) {
			prefetch_size = ClampValue(file_size / ESTIMATED_FOOTER_RATIO, MIN_PREFETCH_SIZE, MAX_PREFETCH_SIZE);
			prefetch_size = MinValue(NextPowerOfTwo(prefetch_size), file_size);
		}

		ResizeableBuffer buf;
		buf.resize(allocator, 8);
		buf.zero();

		transport.Prefetch(file_size - prefetch_size, prefetch_size);
		transport.SetLocation(file_size - 8);
		transport.read(buf.ptr, 8);

		uint32_t footer_len;
		ParseParquetFooter(buf.ptr, file_handle.GetPath(), file_size, encryption_config, footer_len, footer_encrypted);

		auto metadata_pos = file_size - (footer_len + 8);
		transport.SetLocation(metadata_pos);
		if (footer_len > prefetch_size - 8) {
			transport.Prefetch(metadata_pos, footer_len);
		}
	} else {
		auto footer_len = UnsafeNumericCast<uint32_t>(footer_size.GetIndex());
		if (footer_len == 0 || file_size < 12 + footer_len) {
			throw InvalidInputException("Invalid footer length provided for file '%s'", file_handle.GetPath());
		}

		idx_t total_footer_len = footer_len + 8;
		auto metadata_pos = file_size - total_footer_len;
		transport.SetLocation(metadata_pos);
		transport.Prefetch(metadata_pos, total_footer_len);

		auto read_head = transport.GetReadHead(metadata_pos);
		auto data_ptr = read_head->buffer_ptr;

		uint32_t read_footer_len;
		ParseParquetFooter(data_ptr + footer_len, file_handle.GetPath(), file_size, encryption_config, read_footer_len,
		                   footer_encrypted);
		if (read_footer_len != footer_len) {
			throw InvalidInputException("Parquet footer length stored in file is not equal to footer length provided");
		}
	}

	auto metadata = make_uniq<FileMetaData>();
	if (footer_encrypted) {
		auto crypto_metadata = make_uniq<FileCryptoMetaData>();
		crypto_metadata->read(file_proto.get());
		if (crypto_metadata->encryption_algorithm.__isset.AES_GCM_CTR_V1) {
			throw InvalidInputException("File '%s' is encrypted with AES_GCM_CTR_V1, but only AES_GCM_V1 is supported",
			                            file_handle.GetPath());
		}
		ParquetCrypto::Read(*metadata, *file_proto, encryption_config->GetFooterKey(), encryption_util);
	} else {
		metadata->read(file_proto.get());
	}

	// Try to read the GeoParquet metadata (if present)
	auto geo_metadata = GeoParquetFileMetadata::TryRead(*metadata, context);

	return make_shared_ptr<ParquetFileMetadataCache>(std::move(metadata), current_time, std::move(geo_metadata));
}